

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O1

Vec_Ptr_t * Bbl_ManDfs(Bbl_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  Bbl_Obj_t *p_00;
  
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 1000;
  vNodes->nSize = 0;
  ppvVar2 = (void **)malloc(8000);
  vNodes->pArray = ppvVar2;
  for (p_00 = Bbl_ManObjFirst(p); p_00 != (Bbl_Obj_t *)0x0; p_00 = Bbl_ManObjNext(p,p_00)) {
    iVar1 = Bbl_ObjIsLut(p_00);
    if (iVar1 != 0) {
      Bbl_ManDfs_rec(p_00,vNodes);
    }
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Bbl_ManDfs( Bbl_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Bbl_Obj_t * pObj;
    vNodes = Vec_PtrAlloc( 1000 );
    Bbl_ManForEachObj( p, pObj )
        if ( Bbl_ObjIsLut(pObj) )
            Bbl_ManDfs_rec( pObj, vNodes );
    return vNodes;
}